

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::RsRuleSyntax::setChild(RsRuleSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  SyntaxNode *pSVar3;
  RsWeightClauseSyntax *pRVar4;
  RandJoinClauseSyntax *pRVar5;
  
  pSVar3 = TokenOrSyntax::node(&child);
  if (index == 2) {
    if (pSVar3 == (SyntaxNode *)0x0) {
      pRVar4 = (RsWeightClauseSyntax *)0x0;
    }
    else {
      pRVar4 = (RsWeightClauseSyntax *)TokenOrSyntax::node(&child);
    }
    this->weightClause = pRVar4;
  }
  else if (index == 1) {
    (this->prods).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar3->previewNode;
    uVar2 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar1 = pSVar3->parent;
    (this->prods).super_SyntaxListBase.super_SyntaxNode.kind = pSVar3->kind;
    *(undefined4 *)&(this->prods).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar2;
    (this->prods).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
    (this->prods).super_SyntaxListBase.childCount = *(size_t *)(pSVar3 + 1);
    pSVar1 = pSVar3[1].previewNode;
    (this->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar3[1].parent;
    (this->prods).super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar1;
  }
  else {
    if (pSVar3 == (SyntaxNode *)0x0) {
      pRVar5 = (RandJoinClauseSyntax *)0x0;
    }
    else {
      pRVar5 = (RandJoinClauseSyntax *)TokenOrSyntax::node(&child);
    }
    this->randJoin = pRVar5;
  }
  return;
}

Assistant:

void RsRuleSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: randJoin = child.node() ? &child.node()->as<RandJoinClauseSyntax>() : nullptr; return;
        case 1: prods = child.node()->as<SyntaxList<RsProdSyntax>>(); return;
        case 2: weightClause = child.node() ? &child.node()->as<RsWeightClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}